

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp.cpp
# Opt level: O1

bool bgp_update_handle_path_attribute
               (bgp_peer *peer,uchar *buff,uint16_t unfeasible_routes_length,
               uint16_t total_path_attribute_length,adj_ribs_in_data *route_data)

{
  byte bVar1;
  ushort uVar2;
  in_addr __in;
  uchar *puVar3;
  uint uVar4;
  long lVar5;
  undefined6 in_register_0000000a;
  int iVar6;
  undefined6 in_register_00000012;
  char **ppcVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  log_level level;
  bool bVar11;
  ulong uVar12;
  bool bVar13;
  int iVar14;
  uint8_t segment_length;
  uint8_t segment_type;
  uint8_t type;
  string as_list_str;
  uint8_t origin;
  byte local_223;
  uchar local_222;
  uchar local_221;
  adj_ribs_in_data *local_220;
  uint local_214;
  char *local_210;
  undefined8 local_208;
  char local_200;
  undefined7 uStack_1ff;
  int local_1ec;
  long *local_1e8;
  long local_1d8 [2];
  uint local_1c4;
  uchar *local_1c0;
  uchar *local_1b8;
  bgp_peer *local_1b0;
  char *local_1a8 [14];
  ios_base local_138 [264];
  
  iVar8 = (int)CONCAT62(in_register_0000000a,total_path_attribute_length);
  if (iVar8 != 0) {
    iVar6 = (int)CONCAT62(in_register_00000012,unfeasible_routes_length);
    iVar14 = iVar6 + 0x17;
    iVar8 = iVar6 + iVar8 + 0x17;
    local_1c0 = buff + 2;
    local_220 = route_data;
    local_1ec = iVar8;
    local_1b8 = buff;
    local_1b0 = peer;
    do {
      puVar3 = local_1c0;
      local_221 = buff[(long)iVar14 + 1];
      if ((buff[iVar14] & 0x10) == 0) {
        uVar9 = (uint)buff[(long)iVar14 + 2];
        iVar6 = 3;
      }
      else {
        uVar9 = (uint)(ushort)(*(ushort *)(buff + (long)iVar14 + 2) << 8 |
                              *(ushort *)(buff + (long)iVar14 + 2) >> 8);
        iVar6 = 4;
      }
      iVar14 = iVar14 + iVar6;
      switch(local_221) {
      case '\x01':
        local_1a8[0] = (char *)CONCAT71(local_1a8[0]._1_7_,buff[iVar14]);
        (local_220->path_attr).origin = buff[iVar14];
        level = INFO;
        pcVar10 = "Origin %d";
        ppcVar7 = local_1a8;
        goto LAB_001124b6;
      case '\x02':
        local_222 = buff[iVar14];
        local_223 = buff[(long)iVar14 + 1];
        if (local_222 != '\x02') {
LAB_001124a5:
          level = DEBUG;
          pcVar10 = "Unable to interpret segment type %d";
          ppcVar7 = (char **)&local_222;
          goto LAB_001124b6;
        }
        local_210 = &local_200;
        local_208 = 0;
        local_200 = '\0';
        if (local_223 != 0) {
          uVar12 = 0;
          local_214 = uVar9;
          bVar11 = false;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__cxx11::string::append((char *)&local_210);
            if (local_1b0->is_4_octet_as_supported == true) {
              uVar9 = *(uint *)(puVar3 + uVar12 * 4 + (long)iVar14);
              uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                      uVar9 << 0x18;
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              bVar1 = (local_220->path_attr).as_path_length;
            }
            else {
              uVar2 = *(ushort *)(puVar3 + uVar12 * 2 + (long)iVar14);
              uVar9 = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              bVar1 = (local_220->path_attr).as_path_length;
            }
            bVar13 = true;
            if (bVar1 < 0x40) {
              (local_220->path_attr).as_path_length = bVar1 + 1;
              (local_220->path_attr).as_path[bVar1] = uVar9;
              bVar13 = bVar11;
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1e8);
            if (local_1e8 != local_1d8) {
              operator_delete(local_1e8,local_1d8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            buff = local_1b8;
            iVar8 = local_1ec;
            uVar9 = local_214;
            uVar12 = uVar12 + 1;
            bVar11 = bVar13;
          } while (uVar12 < local_223);
          if (bVar13) {
            log<unsigned_char>(WARNING,"Overflowed AS PATH %d",&local_223);
          }
        }
        local_1a8[0] = local_210;
        log<char_const*>(INFO,"AS Path%s",local_1a8);
        if (local_210 != &local_200) {
LAB_00112617:
          operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
        }
        break;
      case '\x03':
        if ((short)uVar9 != 4) {
          __assert_fail("attribute_len == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/kametan0730[P]my_awesome_bgp/bgp.cpp"
                        ,0x138,
                        "bool bgp_update_handle_path_attribute(bgp_peer *, const unsigned char *, uint16_t, uint16_t, adj_ribs_in_data &)"
                       );
        }
        __in.s_addr = *(in_addr_t *)(buff + iVar14);
        (local_220->path_attr).next_hop =
             __in.s_addr >> 0x18 | (__in.s_addr & 0xff0000) >> 8 | (__in.s_addr & 0xff00) << 8 |
             __in.s_addr << 0x18;
        local_1a8[0] = inet_ntoa(__in);
        log<char*>(INFO,"Next Hop %s",local_1a8);
        break;
      case '\x04':
        uVar4 = *(uint *)(buff + iVar14);
        local_1c4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        (local_220->path_attr).med = local_1c4;
        pcVar10 = "MED %d";
        ppcVar7 = (char **)&local_1c4;
        goto LAB_00112566;
      case '\x05':
        uVar4 = *(uint *)(buff + iVar14);
        uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        local_1a8[0] = (char *)CONCAT44(local_1a8[0]._4_4_,uVar4);
        (local_220->path_attr).local_pref = uVar4;
        pcVar10 = "Local Pref %d";
        ppcVar7 = local_1a8;
LAB_00112566:
        log<unsigned_int>(INFO,pcVar10,(uint *)ppcVar7);
        break;
      case '\x06':
        log<>(INFO,"Atomic Aggregate");
        break;
      case '\a':
        if (local_1b0->is_4_octet_as_supported == true) {
          uVar4 = *(uint *)(buff + iVar14);
          iVar14 = iVar14 + 4;
        }
        else {
          lVar5 = (long)iVar14;
          iVar14 = iVar14 + 2;
          uVar4 = (uint)*(ushort *)(buff + lVar5);
        }
        local_210 = (char *)CONCAT44(local_210._4_4_,uVar4);
        local_1a8[0] = inet_ntoa((in_addr)*(in_addr_t *)(buff + iVar14));
        log<unsigned_int,char*>(INFO,"Aggregator %d, %s",(uint *)&local_210,local_1a8);
        break;
      default:
        level = INFO;
        pcVar10 = "Unhandled path attributes type %d";
        ppcVar7 = (char **)&local_221;
LAB_001124b6:
        log<unsigned_char>(level,pcVar10,(uchar *)ppcVar7);
        break;
      case '\x11':
        local_222 = buff[iVar14];
        if (local_222 != '\x02') goto LAB_001124a5;
        bVar1 = buff[(long)iVar14 + 1];
        local_210 = &local_200;
        local_208 = 0;
        local_200 = '\0';
        local_214 = uVar9;
        if ((ulong)bVar1 != 0) {
          uVar12 = 0;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__cxx11::string::append((char *)&local_210);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1e8);
            if (local_1e8 != local_1d8) {
              operator_delete(local_1e8,local_1d8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            uVar12 = uVar12 + 1;
          } while (bVar1 != uVar12);
        }
        local_1a8[0] = local_210;
        log<char_const*>(INFO,"AS4 Path%s",local_1a8);
        buff = local_1b8;
        iVar8 = local_1ec;
        uVar9 = local_214;
        if (local_210 != &local_200) goto LAB_00112617;
      }
      iVar14 = iVar14 + (uVar9 & 0xffff);
    } while (iVar14 < iVar8);
  }
  return true;
}

Assistant:

bool bgp_update_handle_path_attribute(bgp_peer* peer, const unsigned char* buff, uint16_t unfeasible_routes_length, uint16_t total_path_attribute_length, adj_ribs_in_data& route_data){

    int read_length = 19 + 2 + unfeasible_routes_length + 2;
    while(read_length < 19 + 2 + unfeasible_routes_length + 2 + total_path_attribute_length){
        uint8_t flag = buff[read_length];
        uint8_t type = buff[read_length + 1];
        read_length += 2;
        uint16_t attribute_len;
        if(!(flag & EXTENDED_LENGTH)){
            attribute_len = buff[read_length];
            read_length += 1;
        }else{
            memcpy(&attribute_len, &buff[read_length], 2);
            attribute_len = ntohs(attribute_len);
            read_length += 2;
        }
        switch(type){
            case ORIGIN:{
                uint8_t origin = buff[read_length];
                route_data.path_attr.origin = origin;
                log(log_level::INFO, "Origin %d", origin);
            }
                break;
            case AS_PATH:{
                uint8_t segment_type = buff[read_length];
                uint8_t segment_length = buff[read_length + 1];
                if(segment_type == bgp_path_attribute_as_path_segment_type::AS_SEQUENCE){
                    std::string as_list_str;
                    bool is_overflowed = false;
                    for(int i = 0; i < segment_length; i++){
                        std::ostringstream oss;
                        as_list_str.append(" ");
                        if(peer->is_4_octet_as_supported){
                            uint32_t asn;
                            memcpy(&asn, &buff[read_length + 2 + i * 4], 4);
                            asn = ntohl(asn);
                            oss << asn;
                            if(route_data.path_attr.as_path_length < 64){
                                route_data.path_attr.as_path[route_data.path_attr.as_path_length++] = asn;
                            }else{
                                is_overflowed = true;
                            }
                        }else{
                            uint16_t asn;
                            memcpy(&asn, &buff[read_length + 2 + i * 2], 2);
                            asn = ntohs(asn);
                            oss << asn;
                            if(route_data.path_attr.as_path_length < 64){
                                route_data.path_attr.as_path[route_data.path_attr.as_path_length++] = asn;
                            }else{
                                is_overflowed = true;
                            }
                        }
                        as_list_str.append(oss.str());
                    }
                    if(is_overflowed){
                        log(log_level::WARNING, "Overflowed AS PATH %d", segment_length);

                    }
                    log(log_level::INFO, "AS Path%s", as_list_str.c_str());
                }else{
                    log(log_level::DEBUG, "Unable to interpret segment type %d", segment_type);
                }
            }
                break;
            case NEXT_HOP:{
                assert(attribute_len == 4);
                route_data.path_attr.next_hop = buff[read_length]*256*256*256 + buff[read_length + 1]*256*256 + buff[read_length + 2]*256 + buff[read_length + 3];
                log(log_level::INFO, "Next Hop %s", inet_ntoa(in_addr{.s_addr = ntohl(route_data.path_attr.next_hop)}));
            }
                break;
            case MULTI_EXIT_DISC:
                uint32_t med;
                memcpy(&med, &buff[read_length], 4);
                med = ntohl(med);
                route_data.path_attr.med = med;
                log(log_level::INFO, "MED %d", med);
                break;
            case LOCAL_PREF:{
                uint32_t local_pref;
                memcpy(&local_pref, &buff[read_length], 4);
                local_pref = ntohl(local_pref);
                route_data.path_attr.local_pref = local_pref;
                log(log_level::INFO, "Local Pref %d", local_pref);
            }
                break;
            case ATOMIC_AGGREGATE:
                log(log_level::INFO, "Atomic Aggregate");
                break;
            case AGGREGATOR:
            {
                uint32_t asn;
                if(peer->is_4_octet_as_supported){
                    memcpy(&asn, &buff[read_length], 4);
                    read_length += 4;
                }else{
                    uint16_t asn_2;
                    memcpy(&asn_2, &buff[read_length], 2);
                    read_length += 2;
                    asn = asn_2;
                }
                uint32_t address;
                memcpy(&address, &buff[read_length], 4);
                log(log_level::INFO, "Aggregator %d, %s", asn, inet_ntoa(in_addr{.s_addr = address}));
            }
                break;
            case AS4_PATH:
            {
                uint8_t segment_type = buff[read_length];
                uint8_t segment_length = buff[read_length + 1];
                if(segment_type == bgp_path_attribute_as_path_segment_type::AS_SEQUENCE){
                    std::string as_list_str;
                    for(int i = 0; i < segment_length; i++){
                        uint32_t asn;
                        memcpy(&asn, &buff[read_length + 2 + i * 4], 4);
                        asn = ntohl(asn);
                        std::ostringstream oss;
                        oss << asn;
                        as_list_str.append(" ");
                        as_list_str.append(oss.str());
                        /*
                        if(route_data.path_attr.as4_path_length < 64){
                            route_data.path_attr.as4_path[route_data.path_attr.as_path_length++] = asn;
                        }else{
                            log(log_level::WARNING, "Overflowed AS4 PATH %d", segment_length);
                        }*/
                    }
                    log(log_level::INFO, "AS4 Path%s", as_list_str.c_str());
                }else{
                    log(log_level::DEBUG, "Unable to interpret segment type %d", segment_type);
                }
            }
                break;
            default:
                log(log_level::INFO, "Unhandled path attributes type %d", type);
                break;
        }
        read_length += attribute_len;
    }
    return true;
}